

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

void __thiscall
Diligent::DearchiverBase::UnpackRenderPass
          (DearchiverBase *this,RenderPassUnpackInfo *UnpackInfo,IRenderPass **ppRP)

{
  bool bVar1;
  Char *pCVar2;
  ArchiveData *this_00;
  IMemoryAllocator *Allocator;
  pointer this_01;
  undefined8 in_RCX;
  undefined1 local_e0 [8];
  RPData RP;
  string msg_1;
  unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
  *pObjArchive;
  ArchiveData *pArchiveData;
  undefined1 local_40 [8];
  string msg;
  IRenderPass **ppRP_local;
  RenderPassUnpackInfo *UnpackInfo_local;
  DearchiverBase *this_local;
  
  msg.field_2._8_8_ = ppRP;
  bVar1 = anon_unknown_174::VerifyRenderPassUnpackInfo(UnpackInfo,ppRP);
  if (bVar1) {
    *(undefined8 *)msg.field_2._8_8_ = 0;
    if (UnpackInfo->pDevice == (IRenderDevice *)0x0) {
      FormatString<char[26],char[30]>
                ((string *)local_40,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"UnpackInfo.pDevice != nullptr",(char (*) [30])in_RCX);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      in_RCX = (char (*) [30])0x33e;
      DebugAssertionFailed
                (pCVar2,"UnpackRenderPass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                 ,0x33e);
      std::__cxx11::string::~string((string *)local_40);
    }
    if (((UnpackInfo->ModifyRenderPassDesc != (_func_void_RenderPassDesc_ptr_void_ptr *)0x0) ||
        (in_RCX = msg.field_2._8_8_,
        bVar1 = NamedResourceCache<Diligent::IRenderPass>::Get
                          (&(this->m_Cache).RenderPass,RenderPass,UnpackInfo->Name,
                           (IRenderPass **)msg.field_2._8_8_), !bVar1)) &&
       (this_00 = FindArchive(this,RenderPass,UnpackInfo->Name), this_00 != (ArchiveData *)0x0)) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this_00);
      if (!bVar1) {
        FormatString<char[26],char[12]>
                  ((string *)&RP.Desc.pDependencies,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pObjArchive",(char (*) [12])in_RCX);
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"UnpackRenderPass",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                   ,0x34e);
        std::__cxx11::string::~string((string *)&RP.Desc.pDependencies);
      }
      Allocator = GetRawAllocator();
      RPData::RPData((RPData *)local_e0,Allocator,0x400);
      this_01 = std::
                unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                ::operator->(&this_00->pObjArchive);
      bVar1 = DeviceObjectArchive::LoadResourceCommonData<Diligent::DearchiverBase::RPData>
                        (this_01,RenderPass,UnpackInfo->Name,(RPData *)local_e0);
      if (bVar1) {
        if (UnpackInfo->ModifyRenderPassDesc != (_func_void_RenderPassDesc_ptr_void_ptr *)0x0) {
          (*UnpackInfo->ModifyRenderPassDesc)
                    ((RenderPassDesc *)&RP.Allocator.m_pAllocator,UnpackInfo->pUserData);
        }
        (*(UnpackInfo->pDevice->super_IObject)._vptr_IObject[0xf])
                  (UnpackInfo->pDevice,&RP.Allocator.m_pAllocator,msg.field_2._8_8_);
        if (UnpackInfo->ModifyRenderPassDesc == (_func_void_RenderPassDesc_ptr_void_ptr *)0x0) {
          NamedResourceCache<Diligent::IRenderPass>::Set
                    (&(this->m_Cache).RenderPass,RenderPass,UnpackInfo->Name,
                     *(IRenderPass **)msg.field_2._8_8_);
        }
      }
      RPData::~RPData((RPData *)local_e0);
    }
  }
  return;
}

Assistant:

void DearchiverBase::UnpackRenderPass(const RenderPassUnpackInfo& UnpackInfo, IRenderPass** ppRP)
{
    if (!VerifyRenderPassUnpackInfo(UnpackInfo, ppRP))
        return;

    *ppRP = nullptr;

    VERIFY_EXPR(UnpackInfo.pDevice != nullptr);
    // Do not cache modified render passes.
    if (UnpackInfo.ModifyRenderPassDesc == nullptr)
    {
        // Since render pass names must be unique, we use a single cache for all
        // loaded archives.
        if (m_Cache.RenderPass.Get(RPData::ArchiveResType, UnpackInfo.Name, ppRP))
            return;
    }

    // Find the archive that contains this render pass.
    ArchiveData* pArchiveData = FindArchive(RPData::ArchiveResType, UnpackInfo.Name);
    if (pArchiveData == nullptr)
        return;

    const auto& pObjArchive = pArchiveData->pObjArchive;
    VERIFY_EXPR(pObjArchive);

    RPData RP{GetRawAllocator()};
    if (!pArchiveData->pObjArchive->LoadResourceCommonData(RPData::ArchiveResType, UnpackInfo.Name, RP))
        return;

    if (UnpackInfo.ModifyRenderPassDesc != nullptr)
        UnpackInfo.ModifyRenderPassDesc(RP.Desc, UnpackInfo.pUserData);

    UnpackInfo.pDevice->CreateRenderPass(RP.Desc, ppRP);

    if (UnpackInfo.ModifyRenderPassDesc == nullptr)
        m_Cache.RenderPass.Set(RPData::ArchiveResType, UnpackInfo.Name, *ppRP);
}